

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O2

void __thiscall tchecker::local_array_statement_t::output(local_array_statement_t *this)

{
  ostream *in_RSI;
  
  output((local_array_statement_t *)(&this->field_0x0 + *(long *)(*(long *)this + -0x30)),in_RSI);
  return;
}

Assistant:

std::ostream & local_array_statement_t::output(std::ostream & os) const
{
  os << "local ";
  _variable->output(os);
  os << "[";
  _size->output(os);
  os << "]";
  return os;
}